

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationWindingTests.cpp
# Opt level: O2

void __thiscall
vkt::tessellation::anon_unknown_7::WindingTest::WindingTest
          (WindingTest *this,TestContext *testCtx,TessPrimitiveType primitiveType,Winding winding,
          bool yFlip)

{
  ostream *poVar1;
  char *pcVar2;
  char *pcVar3;
  allocator<char> local_1c1;
  string local_1c0;
  string local_1a0 [11];
  
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  if (primitiveType < TESSPRIMITIVETYPE_LAST) {
    pcVar2 = *(char **)(&DAT_00bdb018 + (ulong)primitiveType * 8);
  }
  else {
    pcVar2 = (char *)0x0;
  }
  poVar1 = std::operator<<((ostream *)local_1a0,pcVar2);
  poVar1 = std::operator<<(poVar1,"_");
  pcVar2 = (char *)0x0;
  if (winding == WINDING_CW) {
    pcVar2 = "cw";
  }
  pcVar3 = "ccw";
  if (winding != WINDING_CCW) {
    pcVar3 = pcVar2;
  }
  std::operator<<(poVar1,pcVar3);
  if (yFlip) {
    std::operator<<((ostream *)local_1a0,"_yflip");
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_1a0,"",&local_1c1);
  TestCase::TestCase(&this->super_TestCase,testCtx,&local_1c0,local_1a0);
  std::__cxx11::string::~string((string *)local_1a0);
  std::__cxx11::string::~string((string *)&local_1c0);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TestCase_00bdaf88;
  this->m_primitiveType = primitiveType;
  this->m_winding = winding;
  this->m_yFlip = yFlip;
  return;
}

Assistant:

WindingTest::WindingTest (tcu::TestContext&			testCtx,
						  const TessPrimitiveType	primitiveType,
						  const Winding				winding,
						  bool						yFlip)
	: TestCase			(testCtx, getCaseName(primitiveType, winding, yFlip), "")
	, m_primitiveType	(primitiveType)
	, m_winding			(winding)
	, m_yFlip			(yFlip)
{
}